

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution_x86::forwardDilation
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,conv_func conv)

{
  bool bVar1;
  float *pfVar2;
  code *in_RCX;
  Mat *in_RSI;
  long in_RDI;
  int j_1;
  float *ptr_1;
  int i_1;
  float *outptr_1;
  int c_1;
  int j;
  float *ptr;
  int i;
  float *outptr;
  int c;
  int inner_outh;
  int inner_outw;
  int inner_h;
  int inner_w;
  int y;
  int x;
  Mat inner_top_blob;
  Mat inner_bottom_blob;
  int outh;
  int outw;
  int hpad;
  int wpad;
  Mat bottom_blob_bordered;
  int kernel_extent;
  int dilation;
  int stride;
  int kernel_size;
  int h;
  int w;
  Mat *in_stack_fffffffffffffda0;
  Mat *in_stack_fffffffffffffda8;
  float *in_stack_fffffffffffffdb0;
  float *in_stack_fffffffffffffdb8;
  Mat *in_stack_fffffffffffffdc0;
  int local_20c;
  float in_stack_fffffffffffffe14;
  int in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  int in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  Mat *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  int iVar3;
  int in_stack_fffffffffffffe40;
  float *local_198;
  int local_190;
  int local_18c;
  Mat local_188;
  Mat *local_158;
  int local_14c;
  Mat local_148;
  float *local_118;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  Mat local_f0;
  Mat local_c0;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  undefined4 local_80;
  Mat local_70;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  code *local_28;
  Mat *local_18;
  int local_4;
  
  local_2c = in_RSI->w;
  local_30 = in_RSI->h;
  local_34 = *(int *)(in_RDI + 0x84);
  local_38 = *(int *)(in_RDI + 0x94);
  local_3c = *(int *)(in_RDI + 0x8c);
  local_40 = local_3c * (local_34 + -1) + 1;
  local_28 = in_RCX;
  local_18 = in_RSI;
  Mat::Mat(&local_70,in_RSI);
  if ((*(int *)(in_RDI + 0x9c) < 1) && (*(int *)(in_RDI + 0xa0) < 1)) {
    if ((*(int *)(in_RDI + 0x9c) == -0xe9) && (*(int *)(in_RDI + 0xa0) == -0xe9)) {
      local_84 = (local_40 + ((local_2c + -1) / local_38) * local_38) - local_2c;
      local_88 = (local_40 + ((local_30 + -1) / local_38) * local_38) - local_30;
      if ((0 < local_84) || (0 < local_88)) {
        copy_make_border((Mat *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                         in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                         in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
                         in_stack_fffffffffffffe18,in_stack_fffffffffffffe40,
                         in_stack_fffffffffffffe14);
        bVar1 = Mat::empty(in_stack_fffffffffffffda0);
        if (bVar1) {
          local_4 = -100;
          local_80 = 1;
          goto LAB_00111f15;
        }
      }
      local_2c = local_70.w;
      local_30 = local_70.h;
    }
  }
  else {
    copy_make_border((Mat *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,in_stack_fffffffffffffe20,
                     in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18,in_stack_fffffffffffffe40,
                     in_stack_fffffffffffffe14);
    bVar1 = Mat::empty(in_stack_fffffffffffffda0);
    if (bVar1) {
      local_4 = -100;
      local_80 = 1;
      goto LAB_00111f15;
    }
    local_2c = local_70.w;
    local_30 = local_70.h;
  }
  local_8c = (local_2c - local_40) / local_38 + 1;
  local_90 = (local_30 - local_40) / local_38 + 1;
  Mat::create(in_stack_fffffffffffffdc0,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
              (int)in_stack_fffffffffffffdb8,(int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
              (size_t)in_stack_fffffffffffffda8);
  bVar1 = Mat::empty(in_stack_fffffffffffffda0);
  if (bVar1) {
    local_4 = -100;
    local_80 = 1;
  }
  else {
    Mat::Mat(&local_c0);
    Mat::Mat(&local_f0);
    for (local_f4 = 0; local_f4 < local_3c; local_f4 = local_f4 + 1) {
      for (local_f8 = 0; local_f8 < local_3c; local_f8 = local_f8 + 1) {
        local_fc = ((local_2c - local_f8) + local_3c + -1) / local_3c;
        local_100 = ((local_30 - local_f4) + local_3c + -1) / local_3c;
        local_104 = (local_fc - local_34) / local_38 + 1;
        local_108 = (local_100 - local_34) / local_38 + 1;
        if ((local_c0.w != local_fc) || (local_c0.h != local_100)) {
          Mat::create(in_stack_fffffffffffffdc0,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                      (int)in_stack_fffffffffffffdb8,(int)((ulong)in_stack_fffffffffffffdb0 >> 0x20)
                      ,(size_t)in_stack_fffffffffffffda8);
          bVar1 = Mat::empty(in_stack_fffffffffffffda0);
          if (bVar1) {
            local_4 = -100;
            goto LAB_00111edd;
          }
        }
        if ((local_f0.w != local_104) || (local_f0.h != local_108)) {
          Mat::create(in_stack_fffffffffffffdc0,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                      (int)in_stack_fffffffffffffdb8,(int)((ulong)in_stack_fffffffffffffdb0 >> 0x20)
                      ,(size_t)in_stack_fffffffffffffda8);
          bVar1 = Mat::empty(in_stack_fffffffffffffda0);
          if (bVar1) {
            local_4 = -100;
            goto LAB_00111edd;
          }
        }
        for (local_10c = 0; local_10c < local_18->c; local_10c = local_10c + 1) {
          Mat::channel(in_stack_fffffffffffffda8,(int)((ulong)in_stack_fffffffffffffda0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_148);
          Mat::~Mat((Mat *)0x111a7f);
          local_118 = pfVar2;
          for (local_14c = 0; local_14c < local_100; local_14c = local_14c + 1) {
            Mat::channel(in_stack_fffffffffffffda8,(int)((ulong)in_stack_fffffffffffffda0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_188);
            in_stack_fffffffffffffdc0 =
                 (Mat *)(pfVar2 + (long)(local_3c * local_14c * local_2c) +
                                  (long)(local_f4 * local_2c) + (long)local_f8);
            Mat::~Mat((Mat *)0x111b3d);
            for (local_18c = 0; local_18c < local_fc; local_18c = local_18c + 1) {
              local_118[local_18c] =
                   *(float *)((long)&in_stack_fffffffffffffdc0->data +
                             (long)(local_18c * local_3c) * 4);
            }
            local_118 = local_118 + local_fc;
            local_158 = in_stack_fffffffffffffdc0;
          }
        }
        (*local_28)(&local_c0,&local_f0,in_RDI + 0xb0,in_RDI + 0xe0);
        for (local_190 = 0; local_190 < *(int *)(in_RDI + 0x80); local_190 = local_190 + 1) {
          Mat::channel(in_stack_fffffffffffffda8,(int)((ulong)in_stack_fffffffffffffda0 >> 0x20));
          in_stack_fffffffffffffdb8 = Mat::operator_cast_to_float_((Mat *)&stack0xfffffffffffffe38);
          in_stack_fffffffffffffdb0 =
               in_stack_fffffffffffffdb8 + (long)(local_f4 * local_8c) + (long)local_f8;
          Mat::~Mat((Mat *)0x111d11);
          local_198 = in_stack_fffffffffffffdb0;
          for (iVar3 = 0; iVar3 < local_108; iVar3 = iVar3 + 1) {
            Mat::channel(in_stack_fffffffffffffda8,(int)((ulong)in_stack_fffffffffffffda0 >> 0x20));
            in_stack_fffffffffffffda8 =
                 (Mat *)Mat::operator_cast_to_float_((Mat *)&stack0xfffffffffffffdf8);
            in_stack_fffffffffffffda0 =
                 (Mat *)((long)&in_stack_fffffffffffffda8->data + (long)(iVar3 * local_104) * 4);
            Mat::~Mat((Mat *)0x111d96);
            for (local_20c = 0; local_20c < local_104; local_20c = local_20c + 1) {
              local_198[local_20c * local_3c] =
                   *(float *)((long)&in_stack_fffffffffffffda0->data + (long)local_20c * 4);
            }
            local_198 = local_198 + local_3c * local_8c;
          }
        }
      }
    }
    local_4 = 0;
LAB_00111edd:
    local_80 = 1;
    Mat::~Mat((Mat *)0x111eea);
    Mat::~Mat((Mat *)0x111ef7);
  }
LAB_00111f15:
  Mat::~Mat((Mat *)0x111f22);
  return local_4;
}

Assistant:

int Convolution_x86::forwardDilation(const Mat& bottom_blob, Mat& top_blob, conv_func conv) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    Mat bottom_blob_bordered = bottom_blob;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent + (w - 1) / stride * stride - w;
        int hpad = kernel_extent + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x ++)
    {
        for (int y = 0; y < dilation; y ++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            if (inner_bottom_blob.w != inner_w || inner_bottom_blob.h != inner_h)
            {
                inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c);

                if (inner_bottom_blob.empty())
                {
                    return -100;
                }
            }

            if (inner_top_blob.w != inner_outw || inner_top_blob.h != inner_outh)
            {
                inner_top_blob.create(inner_outw, inner_outh, num_output);

                if (inner_top_blob.empty())
                {
                    return -100;
                }
            }

            #pragma omp parallel for
            for (int c = 0; c < bottom_blob.c; c ++)
            {
                float *outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i ++)
                {
                    const float* ptr = (const float *)bottom_blob_bordered.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j ++)
                    {
                        outptr[j] = ptr[j*dilation];
                    }
                    outptr += inner_w;
                }
            }

            conv(inner_bottom_blob, inner_top_blob, weight_data, bias_data);

            #pragma omp parallel for
            for (int c = 0; c < num_output; c ++)
            {
                float *outptr = (float *)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i ++)
                {
                    const float* ptr = (const float *)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j ++)
                    {
                        outptr[j*dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    return 0;
}